

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall Assimp::ColladaParser::ReadMaterial(ColladaParser *this,Material *pMaterial)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *__s;
  string local_58;
  string *local_38;
  
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar2 != '\0') {
    local_38 = &pMaterial->mEffect;
    do {
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar2 == 1) {
        if (iVar3 != 1) {
LAB_00425496:
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"material");
        if (iVar2 != 0) {
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar2 != 1) goto LAB_00425496;
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar2 = strcmp((char *)CONCAT44(extraout_var_00,iVar2),"instance_effect");
          if (iVar2 == 0) {
            GetAttribute(this,"url");
            iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])();
            if (*(char *)CONCAT44(extraout_var_01,iVar2) != '#') {
              local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_58,"Unknown reference format","");
              ThrowException(this,&local_58);
            }
            __s = (char *)CONCAT44(extraout_var_01,iVar2) + 1;
            pcVar1 = (char *)(pMaterial->mEffect)._M_string_length;
            strlen(__s);
            std::__cxx11::string::_M_replace((ulong)local_38,0,pcVar1,(ulong)__s);
          }
        }
        SkipElement(this);
      }
      else if (iVar3 == 2) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var_02,iVar2),"material");
        if (iVar2 == 0) {
          return;
        }
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"Expected end of <material> element.","");
        ThrowException(this,&local_58);
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar2 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadMaterial(Collada::Material& pMaterial)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("material")) {
                SkipElement();
            }
            else if (IsElement("instance_effect"))
            {
                // referred effect by URL
                int attrUrl = GetAttribute("url");
                const char* url = mReader->getAttributeValue(attrUrl);
                if (url[0] != '#')
                    ThrowException("Unknown reference format");

                pMaterial.mEffect = url + 1;

                SkipElement();
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "material") != 0)
                ThrowException("Expected end of <material> element.");

            break;
        }
    }
}